

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int build_esni_contents_hash
              (ptls_hash_algorithm_t *hash,uint8_t *digest,uint8_t *record_digest,uint16_t group,
              ptls_iovec_t pubkey,uint8_t *client_random)

{
  size_t sVar1;
  uint8_t *puVar2;
  size_t delta;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ptls_iovec_t pubkey_00;
  size_t sVar6;
  int iVar7;
  ptls_hash_context_t *ppVar8;
  uint8_t *puVar9;
  ushort uVar10;
  size_t sVar11;
  uint8_t smallbuf [256];
  ptls_buffer_t local_180;
  uint8_t *local_160;
  ptls_hash_algorithm_t *local_158;
  uint8_t *local_150;
  uint8_t *local_148;
  size_t local_140;
  uint8_t local_138 [264];
  
  local_140 = pubkey.len;
  local_148 = pubkey.base;
  local_180.base = local_138;
  local_180.off = 0;
  local_180.capacity = 0x100;
  local_180.is_allocated = 0;
  iVar7 = ptls_buffer_reserve(&local_180,2);
  sVar6 = local_180.off;
  puVar9 = local_180.base;
  sVar11 = local_180.off;
  if (iVar7 == 0) {
    (local_180.base + local_180.off)[0] = '\0';
    (local_180.base + local_180.off)[1] = '\0';
    sVar1 = local_180.off + 2;
    delta = hash->digest_size;
    local_180.off = sVar1;
    local_160 = digest;
    local_158 = hash;
    local_150 = record_digest;
    if (delta != 0) {
      iVar7 = ptls_buffer_reserve(&local_180,delta);
      sVar11 = local_180.off;
      puVar9 = local_180.base;
      if (iVar7 != 0) goto LAB_001135c8;
      memcpy(local_180.base + local_180.off,local_150,delta);
      local_180.off = sVar11 + delta;
    }
    uVar10 = (short)local_180.off - (short)sVar1;
    *(ushort *)(puVar9 + sVar6) = uVar10 * 0x100 | uVar10 >> 8;
    pubkey_00.len = local_140;
    pubkey_00.base = local_148;
    iVar7 = push_key_share_entry(&local_180,group,pubkey_00);
    puVar9 = local_180.base;
    sVar11 = local_180.off;
    if ((iVar7 == 0) &&
       (iVar7 = ptls_buffer_reserve(&local_180,0x20), puVar9 = local_180.base,
       sVar11 = local_180.off, iVar7 == 0)) {
      uVar3 = *(undefined8 *)(client_random + 8);
      uVar4 = *(undefined8 *)(client_random + 0x10);
      uVar5 = *(undefined8 *)(client_random + 0x18);
      puVar2 = local_180.base + local_180.off;
      *(undefined8 *)puVar2 = *(undefined8 *)client_random;
      *(undefined8 *)(puVar2 + 8) = uVar3;
      *(undefined8 *)(puVar2 + 0x10) = uVar4;
      *(undefined8 *)(puVar2 + 0x18) = uVar5;
      sVar11 = local_180.off + 0x20;
      ppVar8 = (*local_158->create)();
      if (ppVar8 == (ptls_hash_context_t *)0x0) {
        iVar7 = 0x201;
      }
      else {
        (*ppVar8->update)(ppVar8,puVar9,sVar11);
        iVar7 = 0;
        (*ppVar8->final)(ppVar8,local_160,PTLS_HASH_FINAL_MODE_FREE);
      }
    }
  }
LAB_001135c8:
  (*ptls_clear_memory)(puVar9,sVar11);
  if (local_180.is_allocated != 0) {
    free(puVar9);
  }
  return iVar7;
}

Assistant:

static int build_esni_contents_hash(ptls_hash_algorithm_t *hash, uint8_t *digest, const uint8_t *record_digest, uint16_t group,
                                    ptls_iovec_t pubkey, const uint8_t *client_random)
{
    ptls_buffer_t buf;
    uint8_t smallbuf[256];
    int ret;

    /* build ESNIContents */
    ptls_buffer_init(&buf, smallbuf, sizeof(smallbuf));
    ptls_buffer_push_block(&buf, 2, { ptls_buffer_pushv(&buf, record_digest, hash->digest_size); });
    if ((ret = push_key_share_entry(&buf, group, pubkey)) != 0)
        goto Exit;
    ptls_buffer_pushv(&buf, client_random, PTLS_HELLO_RANDOM_SIZE);

    /* calculate digest */
    if ((ret = ptls_calc_hash(hash, digest, buf.base, buf.off)) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&buf);
    return ret;
}